

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cc
# Opt level: O0

ssize_t __thiscall
avro::anon_unknown_3::IStreamBufferCopyIn::read
          (IStreamBufferCopyIn *this,int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined7 uVar3;
  undefined4 in_register_00000034;
  bool local_31;
  bool local_1;
  
  std::istream::read((char *)this->is_,CONCAT44(in_register_00000034,__fd));
  uVar1 = std::ios::bad();
  if ((uVar1 & 1) == 0) {
    uVar2 = std::istream::gcount();
    *(undefined8 *)__nbytes = uVar2;
    uVar1 = std::ios::eof();
    uVar3 = (undefined7)(uVar1 >> 8);
    local_31 = true;
    if ((uVar1 & 1) != 0) {
      local_31 = *(long *)__nbytes != 0;
      uVar3 = (undefined7)(__nbytes >> 8);
    }
    uVar1 = CONCAT71(uVar3,local_31);
    local_1 = local_31;
  }
  else {
    local_1 = false;
  }
  return CONCAT71((int7)(uVar1 >> 8),local_1);
}

Assistant:

bool read(uint8_t* b, size_t toRead, size_t& actual) {
        is_.read(reinterpret_cast<char*>(b), toRead);
        if (is_.bad()) {
            return false;
        }
        actual = static_cast<size_t>(is_.gcount());
        return (! is_.eof() || actual != 0);
    }